

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O2

_Bool Hacl_RSAPSS_rsapss_sign
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint32_t dBits,
                uint64_t *skey,uint32_t saltLen,uint8_t *salt,uint32_t msgLen,uint8_t *msg,
                uint8_t *sgnt)

{
  uint len;
  uint64_t b;
  uint64_t *puVar1;
  Spec_Hash_Definitions_hash_alg a_00;
  uint64_t *puVar2;
  uint32_t i_1;
  uint32_t uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint8_t *b_00;
  void *__s;
  int iVar6;
  undefined7 in_register_00000039;
  uint64_t *puVar7;
  uint32_t i;
  ulong uVar8;
  uint emBits;
  uint64_t *a_01;
  ulong uVar9;
  uint uVar10;
  uint len_00;
  uint8_t auStack_90 [8];
  long lStack_88;
  uint64_t uStack_80;
  undefined1 *local_78;
  ulong local_70;
  uint64_t *local_68;
  uint32_t local_5c;
  uint64_t *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint64_t *local_38;
  
  local_38 = (uint64_t *)CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000039,a));
  uStack_80 = 0x1513db;
  uVar3 = hash_len(a);
  uStack_80 = 0xfffffffffffffff7;
  if (saltLen <= -uVar3 - 9) {
    uVar10 = modBits - 2 >> 3;
    len_00 = uVar10 + 1;
    if (uVar3 + saltLen + 2 <= len_00) {
      emBits = modBits - 1;
      uVar4 = emBits >> 6;
      len = uVar4 + 1;
      local_40 = (ulong)(uVar4 * 8 + 0x17 & 0xfffffff0);
      puVar7 = (uint64_t *)((long)&local_78 + -local_40);
      uVar9 = (ulong)(uVar4 * 8 + 8);
      local_78 = (undefined1 *)&local_78;
      local_68 = puVar7;
      local_5c = dBits;
      local_58 = skey;
      local_50 = (ulong)saltLen;
      local_48 = uVar9;
      *(undefined8 *)((long)&uStack_80 + -local_40) = 0x15144f;
      memset(puVar7,0,uVar9);
      b_00 = (uint8_t *)((long)puVar7 - (ulong)(uVar10 + 0x10 & 0xfffffff0));
      local_70 = (ulong)eBits;
      b_00[-8] = 'p';
      b_00[-7] = '\x14';
      b_00[-6] = '\x15';
      b_00[-5] = '\0';
      b_00[-4] = '\0';
      b_00[-3] = '\0';
      b_00[-2] = '\0';
      b_00[-1] = '\0';
      memset(b_00,0,(ulong)len_00);
      uVar9 = local_50;
      a_00 = (Spec_Hash_Definitions_hash_alg)local_38;
      *(uint8_t **)(b_00 + -0x10) = b_00;
      b_00[-0x18] = 0x90;
      b_00[-0x17] = '\x14';
      b_00[-0x16] = '\x15';
      b_00[-0x15] = '\0';
      b_00[-0x14] = '\0';
      b_00[-0x13] = '\0';
      b_00[-0x12] = '\0';
      b_00[-0x11] = '\0';
      pss_encode(a_00,(uint32_t)uVar9,salt,msgLen,msg,emBits,*(uint8_t **)(b_00 + -0x10));
      puVar7 = local_68;
      b_00[-8] = 0xa1;
      b_00[-7] = '\x14';
      b_00[-6] = '\x15';
      b_00[-5] = '\0';
      b_00[-4] = '\0';
      b_00[-3] = '\0';
      b_00[-2] = '\0';
      b_00[-1] = '\0';
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64(len_00,b_00,puVar7);
      uVar9 = local_48;
      local_50 = (ulong)(emBits >> 3);
      a_01 = (uint64_t *)(b_00 + -local_40);
      a_01[-1] = 0x1514c4;
      memset(a_01,0,uVar9);
      __s = (void *)((long)a_01 - local_40);
      *(undefined8 *)((long)__s + -8) = 0x1514db;
      memset(__s,0,uVar9);
      puVar1 = local_58;
      local_38 = (uint64_t *)((long)local_58 + local_48);
      local_48 = local_48 + (long)local_38;
      local_40 = local_48 + (ulong)((int)local_70 - 1U >> 6) * 8 + 8;
      uVar5 = *local_58;
      *(undefined8 *)((long)__s + -8) = 0x15150f;
      uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar5);
      puVar2 = local_38;
      uVar3 = local_5c;
      puVar7 = local_68;
      *(uint64_t **)((long)__s + -8) = a_01;
      *(ulong *)((long)__s + -0x10) = local_40;
      *(undefined8 *)((long)__s + -0x18) = 0x151531;
      Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
                (len,puVar1,uVar5,puVar2,puVar7,uVar3,*(uint64_t **)((long)__s + -0x10),
                 *(uint64_t **)((long)__s + -8));
      uVar5 = *local_58;
      *(undefined8 *)((long)__s + -8) = 0x15153f;
      uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar5);
      puVar2 = local_38;
      puVar1 = local_58;
      uVar9 = local_70;
      local_38 = a_01;
      *(void **)((long)__s + -8) = __s;
      *(ulong *)((long)__s + -0x10) = local_48;
      *(undefined8 *)((long)__s + -0x18) = 0x151561;
      Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64
                (len,puVar1,uVar5,puVar2,a_01,(uint32_t)uVar9,*(uint64_t **)((long)__s + -0x10),
                 *(uint64_t **)((long)__s + -8));
      *(undefined8 *)((long)__s + -8) = 0xffffffffffffffff;
      uVar9 = *(ulong *)((long)__s + -8);
      for (uVar8 = 0; puVar1 = local_38, len != uVar8; uVar8 = uVar8 + 1) {
        uVar5 = puVar7[uVar8];
        b = *(uint64_t *)((long)__s + uVar8 * 8);
        *(undefined8 *)((long)__s + -8) = 0x151579;
        uVar5 = FStar_UInt64_eq_mask(uVar5,b);
        uVar9 = uVar9 & uVar5;
      }
      for (uVar8 = 0; len != uVar8; uVar8 = uVar8 + 1) {
        local_38[uVar8] = local_38[uVar8] & uVar9;
      }
      iVar6 = (int)local_50;
      *(undefined8 *)((long)__s + -8) = 0x1515ab;
      Hacl_Bignum_Convert_bn_to_bytes_be_uint64(iVar6 + 1,puVar1,sgnt);
      return uVar9 == 0xffffffffffffffff;
    }
  }
  return false;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_sign(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint64_t *skey,
  uint32_t saltLen,
  uint8_t *salt,
  uint32_t msgLen,
  uint8_t *msg,
  uint8_t *sgnt
)
{
  uint32_t hLen = hash_len(a);
  bool
  b = saltLen <= 0xffffffffU - hLen - 8U && saltLen + hLen + 2U <= (modBits - 1U - 1U) / 8U + 1U;
  if (b)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
    uint64_t m[nLen];
    memset(m, 0U, nLen * sizeof (uint64_t));
    uint32_t emBits = modBits - 1U;
    uint32_t emLen = (emBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint8_t), emLen);
    uint8_t em[emLen];
    memset(em, 0U, emLen * sizeof (uint8_t));
    pss_encode(a, saltLen, salt, msgLen, msg, emBits, em);
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(emLen, em, m);
    uint32_t nLen1 = (modBits - 1U) / 64U + 1U;
    uint32_t k = (modBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t s[nLen1];
    memset(s, 0U, nLen1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t m_[nLen1];
    memset(m_, 0U, nLen1 * sizeof (uint64_t));
    uint32_t nLen2 = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    uint64_t *n = skey;
    uint64_t *r2 = skey + nLen2;
    uint64_t *e = skey + nLen2 + nLen2;
    uint64_t *d = skey + nLen2 + nLen2 + eLen;
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu,
      r2,
      m,
      dBits,
      d,
      s);
    uint64_t mu0 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu0,
      r2,
      s,
      eBits,
      e,
      m_);
    uint64_t mask = 0xFFFFFFFFFFFFFFFFULL;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t uu____0 = FStar_UInt64_eq_mask(m[i], m_[i]);
      mask = uu____0 & mask;
    }
    uint64_t mask1 = mask;
    uint64_t eq_m = mask1;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t *os = s;
      uint64_t x = s[i];
      uint64_t x0 = eq_m & x;
      os[i] = x0;
    }
    bool eq_b = eq_m == 0xFFFFFFFFFFFFFFFFULL;
    Hacl_Bignum_Convert_bn_to_bytes_be_uint64(k, s, sgnt);
    bool eq_b0 = eq_b;
    return eq_b0;
  }
  return false;
}